

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_rect_to(nk_draw_list *list,nk_vec2 a,nk_vec2 b,float rounding)

{
  nk_vec2 nVar1;
  float local_78;
  float local_74;
  float local_70;
  float local_68;
  float local_64;
  float local_60;
  float r;
  float rounding_local;
  nk_draw_list *list_local;
  nk_vec2 b_local;
  nk_vec2 a_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x21c6,
                  "void nk_draw_list_path_rect_to(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, float)"
                 );
  }
  if (list != (nk_draw_list *)0x0) {
    list_local._0_4_ = b.x;
    b_local.x = a.x;
    if (0.0 <= list_local._0_4_ - b_local.x) {
      local_60 = list_local._0_4_ - b_local.x;
    }
    else {
      local_60 = -(list_local._0_4_ - b_local.x);
    }
    local_64 = rounding;
    if (local_60 <= rounding) {
      if (0.0 <= list_local._0_4_ - b_local.x) {
        local_68 = list_local._0_4_ - b_local.x;
      }
      else {
        local_68 = -(list_local._0_4_ - b_local.x);
      }
      local_64 = local_68;
    }
    list_local._4_4_ = b.y;
    b_local.y = a.y;
    if (0.0 <= list_local._4_4_ - b_local.y) {
      local_70 = list_local._4_4_ - b_local.y;
    }
    else {
      local_70 = -(list_local._4_4_ - b_local.y);
    }
    if (local_70 <= local_64) {
      if (0.0 <= list_local._4_4_ - b_local.y) {
        local_78 = list_local._4_4_ - b_local.y;
      }
      else {
        local_78 = -(list_local._4_4_ - b_local.y);
      }
      local_74 = local_78;
    }
    else {
      local_74 = local_64;
    }
    if ((local_74 != 0.0) || (NAN(local_74))) {
      nVar1 = nk_vec2(b_local.x + local_74,b_local.y + local_74);
      nk_draw_list_path_arc_to_fast(list,nVar1,local_74,6,9);
      nVar1 = nk_vec2(list_local._0_4_ - local_74,b_local.y + local_74);
      nk_draw_list_path_arc_to_fast(list,nVar1,local_74,9,0xc);
      nVar1 = nk_vec2(list_local._0_4_ - local_74,list_local._4_4_ - local_74);
      nk_draw_list_path_arc_to_fast(list,nVar1,local_74,0,3);
      nVar1 = nk_vec2(b_local.x + local_74,list_local._4_4_ - local_74);
      nk_draw_list_path_arc_to_fast(list,nVar1,local_74,3,6);
    }
    else {
      nk_draw_list_path_line_to(list,a);
      nVar1 = nk_vec2(list_local._0_4_,b_local.y);
      nk_draw_list_path_line_to(list,nVar1);
      nk_draw_list_path_line_to(list,b);
      nVar1 = nk_vec2(b_local.x,list_local._4_4_);
      nk_draw_list_path_line_to(list,nVar1);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_rect_to(struct nk_draw_list *list, struct nk_vec2 a,
    struct nk_vec2 b, float rounding)
{
    float r;
    NK_ASSERT(list);
    if (!list) return;
    r = rounding;
    r = NK_MIN(r, ((b.x-a.x) < 0) ? -(b.x-a.x): (b.x-a.x));
    r = NK_MIN(r, ((b.y-a.y) < 0) ? -(b.y-a.y): (b.y-a.y));

    if (r == 0.0f) {
        nk_draw_list_path_line_to(list, a);
        nk_draw_list_path_line_to(list, nk_vec2(b.x,a.y));
        nk_draw_list_path_line_to(list, b);
        nk_draw_list_path_line_to(list, nk_vec2(a.x,b.y));
    } else {
        nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, a.y + r), r, 6, 9);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, a.y + r), r, 9, 12);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, b.y - r), r, 0, 3);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, b.y - r), r, 3, 6);
    }
}